

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void kratos::MultipleDriverVisitor::check_var(Var *var)

{
  IRNodeKind IVar1;
  long *plVar2;
  IRNode *node2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  Var *pVVar8;
  iterator iVar9;
  IRNode *node1;
  Stmt *pSVar10;
  mapped_type *pmVar11;
  long lVar12;
  _func_int **pp_Var13;
  StmtException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  Stmt *st;
  long *plVar14;
  basic_string_view<char> bVar15;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  Var *local_e8;
  IRNode *local_e0;
  undefined8 local_d8;
  __node_base_ptr local_d0 [4];
  undefined1 local_b0 [8];
  unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
  parents;
  undefined1 local_60 [8];
  shared_ptr<kratos::VarSlice> slice;
  allocator_type local_35;
  uint local_34;
  
  local_b0 = (undefined1  [8])&parents._M_h._M_rehash_policy._M_next_resize;
  parents._M_h._M_buckets = (__buckets_ptr)0x1;
  parents._M_h._M_bucket_count = 0;
  parents._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  parents._M_h._M_element_count._0_4_ = 0x3f800000;
  parents._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  parents._M_h._M_rehash_policy._4_4_ = 0;
  parents._M_h._M_rehash_policy._M_next_resize = 0;
  iVar5 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
  plVar14 = (long *)(CONCAT44(extraout_var,iVar5) + 0x10);
LAB_001db197:
  do {
    do {
      plVar14 = (long *)*plVar14;
      if (plVar14 == (long *)0x0) {
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_b0);
        return;
      }
      bVar3 = has_for_loop((Stmt *)plVar14[1]);
    } while (bVar3);
    plVar2 = *(long **)(plVar14[1] + 0xc0);
    pVVar8 = (Var *)(**(code **)(*plVar2 + 0x148))(plVar2);
  } while (pVVar8 != var);
  if ((int)plVar2[0x2d] == 2) goto LAB_001db1d5;
  goto LAB_001db1ff;
LAB_001db1d5:
  Var::as<kratos::VarSlice>((Var *)local_60);
  cVar4 = (**(code **)(*(_func_int **)local_60 + 0x158))();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&slice);
  if (cVar4 == '\0') {
LAB_001db1ff:
    uVar6 = (**(code **)(*plVar2 + 0x130))(plVar2);
    uVar7 = (**(code **)(*plVar2 + 0x128))(plVar2);
    while (local_34 = uVar6, uVar6 <= uVar7) {
      iVar9 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_b0,&local_34);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        pp_Var13 = (_func_int **)(**(code **)(*(long *)plVar14[1] + 0x20))();
        slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)non_gen_root_parent((Stmt *)plVar14[1]);
        local_60 = (undefined1  [8])pp_Var13;
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>,std::allocator<std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_int&,std::pair<kratos::IRNode*,kratos::Stmt*>>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>,std::allocator<std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)local_b0,&local_34,local_60);
      }
      else {
        node1 = (IRNode *)(**(code **)(*(long *)plVar14[1] + 0x20))();
        pSVar10 = non_gen_root_parent((Stmt *)plVar14[1]);
        pmVar11 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)local_b0,&local_34);
        if (pSVar10 != pmVar11->second) goto LAB_001db364;
        node2 = pmVar11->first;
        IVar1 = (pSVar10->super_IRNode).ast_node_type_;
        if (node1 == node2) {
          if ((IVar1 != StmtKind) || (pSVar10->type_ != Block)) {
LAB_001db364:
            this = (StmtException *)__cxa_allocate_exception(0x10);
            (*(var->super_IRNode)._vptr_IRNode[0x20])(local_d0);
            parents._M_h._M_single_bucket = local_d0[0];
            bVar15 = fmt::v7::to_string_view<char,_0>("{0} has multiple driver in the same scope");
            format_str.data_ = (char *)bVar15.size_;
            format_str.size_ = 0xd;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&parents._M_h._M_single_bucket;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)local_60,(detail *)bVar15.data_,format_str,args);
            local_d8 = plVar14[1];
            __l._M_len = 3;
            __l._M_array = (iterator)&local_e8;
            local_e8 = var;
            local_e0 = node1;
            std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                      ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                       &parents._M_h._M_single_bucket,__l,&local_35);
            StmtException::StmtException
                      (this,(string *)local_60,
                       (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                       &parents._M_h._M_single_bucket);
            __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar12 = __dynamic_cast(pSVar10,&Stmt::typeinfo,&StmtBlock::typeinfo,0);
          if ((*(int *)(lVar12 + 0xd8) != 0) && (*(int *)(lVar12 + 0xd8) != 5)) goto LAB_001db364;
        }
        else if ((((IVar1 == StmtKind) && (pSVar10->type_ == Block)) &&
                 (lVar12 = __dynamic_cast(pSVar10,&Stmt::typeinfo,&StmtBlock::typeinfo,0),
                 *(int *)(lVar12 + 0xd8) == 1)) && (bVar3 = share_root(node1,node2), !bVar3))
        goto LAB_001db364;
      }
      uVar6 = local_34 + 1;
    }
  }
  goto LAB_001db197;
}

Assistant:

static void check_var(Var* var) {
        std::unordered_map<uint32_t, std::pair<IRNode*, Stmt*>> parents;
        for (auto const& stmt : var->sources()) {
            // TODO: FIX THIS
            //  This is a hack to bypass the check if there is a for loop
            if (has_for_loop(stmt.get())) continue;
            auto* v = stmt->left();
            if (v->get_var_root_parent() != var) continue;
            if (v->type() == VarType::Slice) {
                auto slice = v->as<VarSlice>();
                if (slice->sliced_by_var()) continue;
            }
            uint32_t var_low = v->var_low();
            uint32_t var_high = v->var_high();
            for (uint32_t i = var_low; i <= var_high; i++) {
                if (parents.find(i) != parents.end()) {
                    auto* parent = stmt->parent();
                    auto* stmt_parent = non_gen_root_parent(stmt.get());
                    auto const& [ref_parent, ref_stmt_parent] = parents.at(i);
                    // the purpose of the following statement is to make sure that there is no
                    // other assignment that's assigning the same var slice in the same scope
                    // it cannot be driven through different blocks, either.
                    // notice that there is a caveat. in combinational block, as long as the
                    // they are in the same stmt parent, they can have different scope, since
                    // having different scope implies priority. as a result, we need to filter
                    // this case out
                    bool has_multiple_driver = stmt_parent != ref_stmt_parent;
                    if (!has_multiple_driver) {
                        // skip the special case
                        if (parent == ref_parent) {
                            has_multiple_driver = true;
                            if (stmt_parent->ir_node_kind() == IRNodeKind::StmtKind) {
                                auto* st = dynamic_cast<Stmt*>(stmt_parent);
                                if (st && st->type() == StatementType::Block) {
                                    auto* block = dynamic_cast<StmtBlock*>(st);
                                    if (block->block_type() == StatementBlockType::Combinational ||
                                        block->block_type() == StatementBlockType::Latch) {
                                        has_multiple_driver = false;
                                    }
                                }
                            }
                        } else {
                            if (stmt_parent->ir_node_kind() == IRNodeKind::StmtKind) {
                                auto* st = dynamic_cast<Stmt*>(stmt_parent);
                                if (st && st->type() == StatementType::Block) {
                                    auto* block = dynamic_cast<StmtBlock*>(st);
                                    if (block->block_type() == StatementBlockType::Sequential) {
                                        // TODO: this algorithm is not perfect as it only
                                        //  accounts for standalone assignments
                                        has_multiple_driver = !share_root(parent, ref_parent);
                                    }
                                }
                            }
                        }
                    }
                    if (has_multiple_driver) {
                        throw StmtException(::format("{0} has multiple driver in the same scope",
                                                     var->handle_name()),
                                            {var, parent, stmt.get()});
                    }
                } else {
                    parents.emplace(
                        i, std::make_pair(stmt->parent(), non_gen_root_parent(stmt.get())));
                }
            }
        }
    }